

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.h
# Opt level: O1

void __thiscall
MT32Emu::DefaultMidiStreamParser::~DefaultMidiStreamParser(DefaultMidiStreamParser *this)

{
  Bit8u *pBVar1;
  
  (this->super_MidiStreamParser).super_MidiStreamParserImpl._vptr_MidiStreamParserImpl =
       (_func_int **)&PTR__MidiStreamParserImpl_001342e8;
  pBVar1 = (this->super_MidiStreamParser).super_MidiStreamParserImpl.streamBuffer;
  if (pBVar1 != (Bit8u *)0x0) {
    operator_delete__(pBVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

class MT32EMU_EXPORT DefaultMidiStreamParser : public MidiStreamParser {
public:
	explicit DefaultMidiStreamParser(Synth &synth, Bit32u initialStreamBufferCapacity = SYSEX_BUFFER_SIZE);
	void setTimestamp(const Bit32u useTimestamp);
	void resetTimestamp();

protected:
	void handleShortMessage(const Bit32u message);
	void handleSysex(const Bit8u *stream, const Bit32u length);
	void handleSystemRealtimeMessage(const Bit8u realtime);
	void printDebug(const char *debugMessage);

private:
	Synth &synth;
	bool timestampSet;
	Bit32u timestamp;
}